

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O2

Element __thiscall ftxui::vbox(ftxui *this,Elements *children)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Element EVar2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::VBox,_std::allocator<ftxui::(anonymous_namespace)::VBox>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_78;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_68;
  Elements local_48;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_30 = 0;
  p_Var1 = (pointer)operator_new(0x70);
  local_78._M_alloc = &__a2;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ed18;
  local_48.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_ptr = p_Var1;
  Node::Node((Node *)&p_Var1->_M_impl,&local_48);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_48);
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__Node_0011ed68;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_68);
  local_78._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::VBox,_std::allocator<ftxui::(anonymous_namespace)::VBox>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_78);
  *(_Impl **)this = &p_Var1->_M_impl;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(this + 8) = p_Var1;
  local_30 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vbox(Elements children) {
  return std::make_shared<VBox>(std::move(children));
}